

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QRhiGles2::DeferredReleaseEntry>::reallocateAndGrow
          (QArrayDataPointer<QRhiGles2::DeferredReleaseEntry> *this,GrowthPosition where,qsizetype n
          ,QArrayDataPointer<QRhiGles2::DeferredReleaseEntry> *old)

{
  long lVar1;
  bool bVar2;
  QPodArrayOps<QRhiGles2::DeferredReleaseEntry> *this_00;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  QArrayDataPointer<QRhiGles2::DeferredReleaseEntry> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QRhiGles2::DeferredReleaseEntry> dp;
  undefined4 in_stack_ffffffffffffff78;
  AllocationOption in_stack_ffffffffffffff7c;
  QArrayDataPointer<QRhiGles2::DeferredReleaseEntry> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QRhiGles2::DeferredReleaseEntry> *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((in_ESI != 0) || (in_RCX != 0)) || (bVar2 = needsDetach(in_stack_ffffffffffffff80), bVar2))
     || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QRhiGles2::DeferredReleaseEntry> *)&DAT_aaaaaaaaaaaaaaaa,
                 -0x5555555555555556,0xaaaaaaaa);
    if (0 < in_RDX) {
      qt_noop();
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach(in_stack_ffffffffffffff80);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QPodArrayOps<QRhiGles2::DeferredReleaseEntry> *)
                  operator->((QArrayDataPointer<QRhiGles2::DeferredReleaseEntry> *)
                             &stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QRhiGles2::DeferredReleaseEntry> *)0x942b2c);
        begin((QArrayDataPointer<QRhiGles2::DeferredReleaseEntry> *)0x942b3b);
        QtPrivate::QPodArrayOps<QRhiGles2::DeferredReleaseEntry>::copyAppend
                  (this_00,(DeferredReleaseEntry *)in_stack_ffffffffffffff88,
                   (DeferredReleaseEntry *)in_stack_ffffffffffffff80);
      }
      else {
        in_stack_ffffffffffffff80 =
             (QArrayDataPointer<QRhiGles2::DeferredReleaseEntry> *)
             operator->((QArrayDataPointer<QRhiGles2::DeferredReleaseEntry> *)
                        &stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QRhiGles2::DeferredReleaseEntry> *)0x942b71);
        begin((QArrayDataPointer<QRhiGles2::DeferredReleaseEntry> *)0x942b80);
        QtPrivate::QPodArrayOps<QRhiGles2::DeferredReleaseEntry>::moveAppend
                  ((QPodArrayOps<QRhiGles2::DeferredReleaseEntry> *)in_stack_ffffffffffffff80,
                   (DeferredReleaseEntry *)
                   CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (DeferredReleaseEntry *)0x942b9b);
      }
    }
    swap(in_stack_ffffffffffffff80,
         (QArrayDataPointer<QRhiGles2::DeferredReleaseEntry> *)
         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (in_RCX != 0) {
      swap(in_stack_ffffffffffffff80,
           (QArrayDataPointer<QRhiGles2::DeferredReleaseEntry> *)
           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    ~QArrayDataPointer(in_stack_ffffffffffffff80);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity(in_stack_ffffffffffffff80);
    freeSpaceAtEnd(in_stack_ffffffffffffff88);
    QtPrivate::QPodArrayOps<QRhiGles2::DeferredReleaseEntry>::reallocate
              ((QPodArrayOps<QRhiGles2::DeferredReleaseEntry> *)in_stack_ffffffffffffff88,
               (qsizetype)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }